

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::objectivec::BuildCommentsString_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,SourceLocation *location,
          bool prefer_single_line)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  reference str;
  char *__lhs;
  byte local_351;
  pointer local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  allocator<char> local_2c9;
  string local_2c8;
  allocator<char> local_2a1;
  string local_2a0;
  string local_280;
  allocator<char> local_259;
  string local_258;
  allocator<char> local_231;
  string local_230;
  string local_210;
  allocator<char> local_1e9;
  string local_1e8;
  allocator<char> local_1c1;
  string local_1c0;
  string local_1a0;
  allocator<char> local_179;
  string local_178;
  allocator<char> local_151;
  string local_150;
  string local_130;
  allocator<char> local_109;
  string local_108;
  undefined1 local_e8 [8];
  string line;
  int i;
  bool add_leading_space;
  string epilogue;
  undefined1 local_98 [8];
  string suffix;
  string prefix;
  allocator<char> local_4d [13];
  undefined1 local_40 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  string *comments;
  bool prefer_single_line_local;
  SourceLocation *location_local;
  string *final_comments;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    local_348 = (pointer)(this + 0x10);
  }
  else {
    local_348 = (pointer)(this + 0x30);
  }
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_348;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_40);
  SplitStringAllowEmpty
            (lines.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,"\n",
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_40);
  while( true ) {
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_40);
    local_351 = 0;
    if (!bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_40);
      local_351 = std::__cxx11::string::empty();
    }
    if ((local_351 & 1) == 0) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_40);
  }
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_40);
  if (sVar3 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",local_4d)
    ;
    std::allocator<char>::~allocator(local_4d);
    goto LAB_003b1db4;
  }
  std::__cxx11::string::string((string *)(suffix.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_98);
  epilogue.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::string((string *)&i);
  line.field_2._M_local_buf[0xf] = '\0';
  if (((ulong)location & 1) == 0) {
LAB_003b15bf:
    std::__cxx11::string::operator=((string *)(suffix.field_2._M_local_buf + 8),"* ");
    std::__cxx11::string::operator=((string *)local_98,"\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/**\n");
    std::__cxx11::string::operator=((string *)&i," **/\n");
    line.field_2._M_local_buf[0xf] = '\x01';
  }
  else {
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_40);
    if (sVar3 != 1) goto LAB_003b15bf;
    std::__cxx11::string::operator=((string *)(suffix.field_2._M_local_buf + 8),"/** ");
    std::__cxx11::string::operator=((string *)local_98," */\n");
  }
  line.field_2._8_4_ = 0;
  while( true ) {
    uVar2 = (ulong)(int)line.field_2._8_4_;
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_40);
    if (sVar3 <= uVar2) break;
    str = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_40,(long)(int)line.field_2._8_4_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108," ",&local_109);
    StripPrefixString((string *)local_e8,str,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator(&local_109);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"\\",&local_151);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"\\\\",&local_179);
    StringReplace(&local_130,(string *)local_e8,&local_150,&local_178,true);
    std::__cxx11::string::operator=((string *)local_e8,(string *)&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_178);
    std::allocator<char>::~allocator(&local_179);
    std::__cxx11::string::~string((string *)&local_150);
    std::allocator<char>::~allocator(&local_151);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"@",&local_1c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"\\@",&local_1e9);
    StringReplace(&local_1a0,(string *)local_e8,&local_1c0,&local_1e8,true);
    std::__cxx11::string::operator=((string *)local_e8,(string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::allocator<char>::~allocator(&local_1e9);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::allocator<char>::~allocator(&local_1c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"/*",&local_231);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"/\\*",&local_259);
    StringReplace(&local_210,(string *)local_e8,&local_230,&local_258,true);
    std::__cxx11::string::operator=((string *)local_e8,(string *)&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_258);
    std::allocator<char>::~allocator(&local_259);
    std::__cxx11::string::~string((string *)&local_230);
    std::allocator<char>::~allocator(&local_231);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"*/",&local_2a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,"*\\/",&local_2c9);
    StringReplace(&local_280,(string *)local_e8,&local_2a0,&local_2c8,true);
    std::__cxx11::string::operator=((string *)local_e8,(string *)&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::allocator<char>::~allocator(&local_2c9);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::allocator<char>::~allocator(&local_2a1);
    std::operator+(&local_2f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&suffix.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8);
    std::__cxx11::string::operator=((string *)local_e8,(string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_2f0);
    StripWhitespace((string *)local_e8);
    __lhs = "";
    if ((line.field_2._M_local_buf[0xf] & 1U) != 0) {
      __lhs = " ";
    }
    std::operator+(&local_310,__lhs,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8);
    std::__cxx11::string::operator=((string *)local_e8,(string *)&local_310);
    std::__cxx11::string::~string((string *)&local_310);
    std::operator+(&local_330,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_330);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)local_e8);
    line.field_2._8_4_ = line.field_2._8_4_ + 1;
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&i);
  epilogue.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string((string *)&i);
  if ((epilogue.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)(suffix.field_2._M_local_buf + 8));
LAB_003b1db4:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_40);
  return __return_storage_ptr__;
}

Assistant:

string BuildCommentsString(const SourceLocation& location,
                           bool prefer_single_line) {
  const string& comments = location.leading_comments.empty()
                               ? location.trailing_comments
                               : location.leading_comments;
  vector<string> lines;
  SplitStringAllowEmpty(comments, "\n", &lines);
  while (!lines.empty() && lines.back().empty()) {
    lines.pop_back();
  }
  // If there are no comments, just return an empty string.
  if (lines.size() == 0) {
    return "";
  }

  string prefix;
  string suffix;
  string final_comments;
  string epilogue;

  bool add_leading_space = false;

  if (prefer_single_line && lines.size() == 1) {
    prefix = "/** ";
    suffix = " */\n";
  } else {
    prefix = "* ";
    suffix = "\n";
    final_comments += "/**\n";
    epilogue = " **/\n";
    add_leading_space = true;
  }

  for (int i = 0; i < lines.size(); i++) {
    string line = StripPrefixString(lines[i], " ");
    // HeaderDoc and appledoc use '\' and '@' for markers; escape them.
    line = StringReplace(line, "\\", "\\\\", true);
    line = StringReplace(line, "@", "\\@", true);
    // Decouple / from * to not have inline comments inside comments.
    line = StringReplace(line, "/*", "/\\*", true);
    line = StringReplace(line, "*/", "*\\/", true);
    line = prefix + line;
    StripWhitespace(&line);
    // If not a one line, need to add the first space before *, as
    // StripWhitespace would have removed it.
    line = (add_leading_space ? " " : "") + line;
    final_comments += line + suffix;
  }
  final_comments += epilogue;
  return final_comments;
}